

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::StringTree>
                 (char *target,ArrayPtr<const_char> *first,CappedArray<char,_26UL> *rest,
                 StringTree *rest_1)

{
  size_t sVar1;
  char *pcVar2;
  size_t __n;
  size_t sVar3;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    pcVar2 = first->ptr;
    sVar3 = 0;
    do {
      target[sVar3] = pcVar2[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
    target = target + sVar3;
  }
  __n = rest->currentSize;
  if (__n != 0) {
    memcpy(target,rest->content,__n);
    target = target + __n;
  }
  StringTree::flattenTo(rest_1,target);
  return target + rest_1->size_;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}